

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadednormalizer2impl.cpp
# Opt level: O0

Normalizer2Impl * icu_63::Normalizer2Factory::getNFKCImpl(UErrorCode *errorCode)

{
  Norm2AllModes *pNVar1;
  Normalizer2Impl *local_20;
  Norm2AllModes *allModes;
  UErrorCode *errorCode_local;
  
  pNVar1 = Norm2AllModes::getNFKCInstance(errorCode);
  if (pNVar1 == (Norm2AllModes *)0x0) {
    local_20 = (Normalizer2Impl *)0x0;
  }
  else {
    local_20 = pNVar1->impl;
  }
  return local_20;
}

Assistant:

const Normalizer2Impl *
Normalizer2Factory::getNFKCImpl(UErrorCode &errorCode) {
    const Norm2AllModes *allModes=Norm2AllModes::getNFKCInstance(errorCode);
    return allModes!=NULL ? allModes->impl : NULL;
}